

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::setPartials
          (BeagleCPUImpl<double,_1,_0> *this,int bufferIndex,double *inPartials)

{
  double **ppdVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  long lVar5;
  uint uVar6;
  double *__dest;
  int iVar7;
  ulong uVar8;
  
  iVar3 = -5;
  if ((-1 < bufferIndex) && (bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc)) {
    ppdVar1 = this->gPartials;
    if (ppdVar1[(uint)bufferIndex] == (double *)0x0) {
      pdVar4 = (double *)malloc((long)this->kPartialsSize << 3);
      ppdVar1[(uint)bufferIndex] = pdVar4;
      if (this->gPartials[(uint)bufferIndex] == (double *)0x0) {
        return -2;
      }
    }
    if (0 < this->kCategoryCount) {
      pdVar4 = this->gPartials[(uint)bufferIndex];
      iVar3 = 0;
      do {
        iVar2 = this->kPatternCount;
        if (0 < iVar2) {
          iVar7 = 0;
          __dest = pdVar4;
          do {
            memcpy(__dest,inPartials,(ulong)(uint)this->kStateCount << 3);
            uVar6 = this->kStateCount;
            lVar5 = (long)(int)uVar6;
            pdVar4 = __dest + lVar5;
            if ((int)uVar6 < this->kPartialsPaddedStateCount) {
              uVar8 = (ulong)(this->kPartialsPaddedStateCount + ~uVar6);
              memset(pdVar4,0,uVar8 * 8 + 8);
              pdVar4 = __dest + uVar8 + lVar5 + 1;
            }
            inPartials = inPartials + lVar5;
            iVar7 = iVar7 + 1;
            iVar2 = this->kPatternCount;
            __dest = pdVar4;
          } while (iVar7 < iVar2);
        }
        uVar6 = (this->kPaddedPatternCount - iVar2) * this->kPartialsPaddedStateCount;
        if (0 < (int)uVar6) {
          memset(pdVar4,0,(ulong)uVar6 << 3);
          pdVar4 = pdVar4 + (ulong)(uVar6 - 1) + 1;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < this->kCategoryCount);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setPartials(int bufferIndex,
                               const double* inPartials) {
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gPartials[bufferIndex] == NULL) {
        gPartials[bufferIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kPartialsSize);
        if (gPartials[bufferIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset = inPartials;
    REALTYPE* tmpRealPartialsOffset = gPartials[bufferIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}